

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O2

wchar_t * ON_UuidToString(ON_UUID *uuid,wchar_t *s)

{
  int i;
  long lVar1;
  char x [37];
  char local_38 [48];
  
  if (s != (wchar_t *)0x0) {
    ON_UuidToString(uuid,local_38);
    for (lVar1 = 0; lVar1 != 0x25; lVar1 = lVar1 + 1) {
      s[lVar1] = (int)local_38[lVar1];
    }
  }
  return s;
}

Assistant:

wchar_t* ON_UuidToString( const ON_UUID& uuid, wchar_t* s)
{
  // s - [out]  The s[] char array must have length >= 37.  
  //            The returned char array will have a 36 
  //            character uuid in s[0..35] and a null in s[36].

  // NOTE WELL: 
  //   This code has to work on non-Windows OSs and on both big and
  //   little endian CPUs.  The result must satisfy
  //   uuid == ON_UuidFromString(ON_UuidToString(uuid,s))
  char x[37];
  if ( s && ON_UuidToString(uuid,x) )
  {
    int i;
    for (i = 0; i < 37; i++ )
    {
      s[i] = (wchar_t)x[i];
    }
  }
  else
  {
    s = 0;
  }
  return s;
}